

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_show.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformShow(Transformer *this,PGVariableShowStmt *stmt)

{
  int iVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ShowRef_*,_false> _Var4;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  pointer pSVar9;
  pointer pSVar10;
  long in_RDX;
  pointer *__ptr;
  string table_name;
  _Head_base<0UL,_duckdb::ShowRef_*,_false> local_98;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_90;
  undefined1 local_88 [32];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  make_uniq<duckdb::SelectNode>();
  pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_90);
  make_uniq<duckdb::StarExpression>();
  local_68._M_dataplus._M_p = (pointer)local_88._0_8_;
  local_88._0_8_ = (long *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar9->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)(local_88 + 0x20));
  if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  if ((long *)local_88._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_88._0_8_ + 8))();
  }
  make_uniq<duckdb::ShowRef>();
  if (*(long *)(in_RDX + 0x10) != 0) {
    pSVar10 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                        ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                         &local_98);
    ::std::__cxx11::string::assign((char *)&pSVar10->table_name);
    goto LAB_0066b40d;
  }
  if (*(long *)(*(long *)(in_RDX + 8) + 0x10) != 0) goto LAB_0066b40d;
  ::std::__cxx11::string::string
            ((string *)local_88,*(char **)(*(long *)(in_RDX + 8) + 0x18),(allocator *)&local_48);
  StringUtil::Lower((string *)(local_88 + 0x20),(string *)local_88);
  ::std::__cxx11::string::~string((string *)local_88);
  bVar8 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_88 + 0x20),"databases");
  if (bVar8) {
LAB_0066b3a9:
    ::std::operator+(&local_48,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_88 + 0x20));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_48,"\"");
    pSVar10 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                        ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                         &local_98);
    ::std::__cxx11::string::operator=((string *)&pSVar10->table_name,(string *)local_88);
    ::std::__cxx11::string::~string((string *)local_88);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    bVar8 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_88 + 0x20),"tables");
    if (bVar8) goto LAB_0066b3a9;
    bVar8 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_88 + 0x20),"variables");
    if (bVar8) goto LAB_0066b3a9;
  }
  ::std::__cxx11::string::~string((string *)(local_88 + 0x20));
LAB_0066b40d:
  pSVar10 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                      ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                       &local_98);
  if ((pSVar10->table_name)._M_string_length == 0) {
    make_uniq<duckdb::SelectNode>();
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)(local_88 + 0x20));
    make_uniq<duckdb::StarExpression>();
    local_88._0_8_ = local_48._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar9->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_88);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
    local_88._0_8_ = (TableRef *)0x0;
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
    TransformRangeVar((Transformer *)local_88,(PGRangeVar *)stmt);
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)(local_88 + 0x20));
    uVar6 = local_88._0_8_;
    local_88._0_8_ = (long *)0x0;
    _Var2._M_head_impl =
         (pSVar9->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar9->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar6;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    _Var7._M_p = local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)0x0;
    pSVar10 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                        ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                         &local_98);
    _Var3._M_head_impl =
         (pSVar10->query).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar10->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)_Var7._M_p;
    if (_Var3._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if ((long *)local_88._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
    if ((QueryNode *)local_68._M_dataplus._M_p != (QueryNode *)0x0) {
      (*(*(_func_int ***)local_68._M_dataplus._M_p)[1])();
    }
  }
  iVar1 = *(int *)(in_RDX + 0x18);
  pSVar10 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                      ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                       &local_98);
  _Var4._M_head_impl = local_98._M_head_impl;
  pSVar10->show_type = iVar1 == 0;
  local_98._M_head_impl = (ShowRef *)0x0;
  pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_90);
  _Var2._M_head_impl =
       (pSVar9->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar9->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       &(_Var4._M_head_impl)->super_TableRef;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
  }
  _Var5._M_head_impl = local_90._M_head_impl;
  local_90._M_head_impl = (SelectNode *)0x0;
  (this->parent).ptr = (Transformer *)_Var5._M_head_impl;
  if (local_98._M_head_impl != (ShowRef *)0x0) {
    (*((local_98._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
    if (local_90._M_head_impl != (SelectNode *)0x0) {
      (*((local_90._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformShow(duckdb_libpgquery::PGVariableShowStmt &stmt) {
	// create the query that holds the show statement
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list.push_back(make_uniq<StarExpression>());
	auto showref = make_uniq<ShowRef>();
	if (stmt.set) {
		// describing a set (e.g. SHOW ALL TABLES) - push it in the table name
		showref->table_name = stmt.set;
	} else if (!stmt.relation->schemaname) {
		// describing an unqualified relation - check if this is a "special" relation
		string table_name = StringUtil::Lower(stmt.relation->relname);
		if (table_name == "databases" || table_name == "tables" || table_name == "variables") {
			showref->table_name = "\"" + std::move(table_name) + "\"";
		}
	}
	if (showref->table_name.empty()) {
		// describing a single relation
		// wrap the relation in a "SELECT * FROM [table_name]" query
		auto show_select_node = make_uniq<SelectNode>();
		show_select_node->select_list.push_back(make_uniq<StarExpression>());
		auto tableref = TransformRangeVar(*stmt.relation);
		show_select_node->from_table = std::move(tableref);
		showref->query = std::move(show_select_node);
	}

	showref->show_type = stmt.is_summary ? ShowType::SUMMARY : ShowType::DESCRIBE;
	select_node->from_table = std::move(showref);
	return std::move(select_node);
}